

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfour.c
# Opt level: O3

void arcfour_block(void *handle,void *vblk,int len)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  bVar3 = *handle;
  bVar4 = *(byte *)((long)handle + 1);
  if (0 < len) {
    uVar5 = 1;
    do {
      bVar3 = bVar3 + 1;
      uVar6 = (ulong)bVar3;
      cVar2 = *(char *)((long)handle + uVar6 + 2);
      bVar4 = bVar4 + cVar2;
      *(undefined1 *)((long)handle + uVar6 + 2) = *(undefined1 *)((long)handle + (ulong)bVar4 + 2);
      *(char *)((long)handle + (ulong)bVar4 + 2) = cVar2;
      pbVar1 = (byte *)((long)vblk + (uVar5 - 1));
      *pbVar1 = *pbVar1 ^ *(byte *)((long)handle +
                                   (ulong)(byte)(cVar2 + *(char *)((long)handle + uVar6 + 2)) + 2);
      bVar7 = uVar5 != (uint)len;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  *(byte *)handle = bVar3;
  *(byte *)((long)handle + 1) = bVar4;
  return;
}

Assistant:

static void arcfour_block(void *handle, void *vblk, int len)
{
    unsigned char *blk = (unsigned char *)vblk;
    ArcfourContext *ctx = (ArcfourContext *)handle;
    unsigned k;
    unsigned char tmp, i, j, *s;

    s = ctx->s;
    i = ctx->i; j = ctx->j;
    for (k = 0; (int)k < len; k++) {
        i  = (i + 1) & 0xff;
        j  = (j + s[i]) & 0xff;
        tmp = s[i]; s[i] = s[j]; s[j] = tmp;
        blk[k] ^= s[(s[i]+s[j]) & 0xff];
    }
    ctx->i = i; ctx->j = j;
}